

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O0

void __thiscall IntersectionHelper::intersect_by_8(IntersectionHelper *this)

{
  IntersectionHelper *in_RDI;
  bool bVar1;
  IntersectionHelper *in_stack_00000028;
  
  while( true ) {
    bVar1 = false;
    if (in_RDI->run_it_ < in_RDI->run_end_ + -8) {
      bVar1 = in_RDI->seq_it_ < in_RDI->seq_end_;
    }
    if (!bVar1) break;
    bVar1 = step_by_8(in_stack_00000028);
    if (!bVar1) {
      step_single(in_RDI);
    }
  }
  return;
}

Assistant:

void IntersectionHelper::intersect_by_8() {
    while (run_it_ < run_end_ - 8 && seq_it_ < seq_end_) {
        if (step_by_8()) {
            continue;
        }
        step_single();
    }
}